

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall
benchmark::internal::BenchmarkImp::DenseRange(BenchmarkImp *this,int start,int limit)

{
  char *check;
  int line;
  CheckHandler local_38;
  int local_2c;
  
  if ((this->arg_count_ == 1) || (this->arg_count_ == -1)) {
    GetNullLogInstance();
    this->arg_count_ = 1;
    if (start < 0) {
      check = "(start) >= (0)";
      line = 0x1b4;
    }
    else {
      GetNullLogInstance();
      if (start <= limit) {
        GetNullLogInstance();
        for (local_38.log_._0_4_ = start; (int)local_38.log_ <= limit;
            local_38.log_._0_4_ = (int)local_38.log_ + 1) {
          local_2c = -1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->args_,
                     (int *)&local_38,&local_2c);
        }
        return;
      }
      check = "(start) <= (limit)";
      line = 0x1b5;
    }
  }
  else {
    check = "arg_count_ == -1 || arg_count_ == 1";
    line = 0x1b2;
  }
  CheckHandler::CheckHandler
            (&local_38,check,
             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
             ,"DenseRange",line);
  CheckHandler::~CheckHandler(&local_38);
}

Assistant:

void BenchmarkImp::DenseRange(int start, int limit) {
  CHECK(arg_count_ == -1 || arg_count_ == 1);
  arg_count_ = 1;
  CHECK_GE(start, 0);
  CHECK_LE(start, limit);
  for (int arg = start; arg <= limit; arg++) {
    args_.emplace_back(arg, -1);
  }
}